

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QString_&,_ProString_&>::convertTo<QString>
          (QString *__return_storage_ptr__,QStringBuilder<QString_&,_ProString_&> *this)

{
  int iVar1;
  long lVar2;
  char16_t *__dest;
  ProString *pPVar3;
  CutResult CVar4;
  char16_t *pcVar5;
  char16_t *__src;
  long lVar6;
  long in_FS_OFFSET;
  long local_40;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->a->d).ptr == (char16_t *)0x0) && ((this->b->m_string).d.ptr == (char16_t *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_001b8502;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    iVar1 = this->b->m_length;
    lVar2 = (this->a->d).size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,iVar1 + lVar2,Uninitialized);
    __dest = (__return_storage_ptr__->d).ptr;
    lVar2 = (this->a->d).size;
    if (lVar2 != 0) {
      pcVar5 = (this->a->d).ptr;
      if (pcVar5 == (char16_t *)0x0) {
        pcVar5 = (char16_t *)&QString::_empty;
      }
      memcpy(__dest,pcVar5,lVar2 * 2);
    }
    pPVar3 = this->b;
    lVar6 = (long)pPVar3->m_length;
    if (lVar6 != 0) {
      pcVar5 = (pPVar3->m_string).d.ptr;
      local_38 = (long)pPVar3->m_offset;
      local_40 = lVar6;
      CVar4 = QtPrivate::QContainerImplHelper::mid((pPVar3->m_string).d.size,&local_38,&local_40);
      __src = (char16_t *)0x0;
      if (CVar4 != Null) {
        __src = pcVar5 + local_38;
      }
      memcpy(__dest + lVar2,__src,lVar6 * 2);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_001b8502:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }